

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetIntegerVerifier::verifyInteger4Mask
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,
          bool enableRef0,GLint reference1,bool enableRef1,GLint reference2,bool enableRef2,
          GLint reference3,bool enableRef3)

{
  ostringstream *this_00;
  bool bVar1;
  bool *pbVar2;
  bool *pbVar3;
  bool *pbVar4;
  StateQueryMemoryWriteGuard<int[4]> local_1e8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1e8.m_postguard[0] = -0x21212122;
  local_1e8.m_postguard[1] = -0x21212122;
  local_1e8.m_postguard[2] = -0x21212122;
  local_1e8.m_postguard[3] = -0x21212122;
  local_1e8.m_value[0] = -0x21212122;
  local_1e8.m_value[1] = -0x21212122;
  local_1e8.m_value[2] = -0x21212122;
  local_1e8.m_value[3] = -0x21212122;
  local_1e8.m_preguard[0] = -0x21212122;
  local_1e8.m_preguard[1] = -0x21212122;
  local_1e8.m_preguard[2] = -0x21212122;
  local_1e8.m_preguard[3] = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1e8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                    (&local_1e8,testCtx);
  if (bVar1) {
    if (((((enableRef0) && (local_1e8.m_value[0] != reference0)) ||
         ((enableRef1 && (local_1e8.m_value[1] != reference1)))) ||
        ((enableRef2 && (local_1e8.m_value[2] != reference2)))) ||
       ((enableRef3 && (local_1e8.m_value[3] != reference3)))) {
      local_1b0._0_8_ = testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"// ERROR: expected ",0x13);
      pbVar3 = (bool *)0x1b8ef7b;
      pbVar2 = (bool *)0x1b8ef7b;
      if (enableRef0) {
        pbVar2 = glcts::fixed_sample_locations_values + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,pbVar2,(ulong)!enableRef0);
      std::ostream::operator<<(this_00,reference0);
      pbVar4 = (bool *)0x1b186b7;
      pbVar2 = (bool *)0x1b186b7;
      if (enableRef0) {
        pbVar2 = glcts::fixed_sample_locations_values + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,pbVar2,(ulong)!enableRef0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      pbVar2 = (bool *)0x1b8ef7b;
      if (enableRef1) {
        pbVar2 = glcts::fixed_sample_locations_values + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,pbVar2,(ulong)!enableRef1);
      std::ostream::operator<<(this_00,reference1);
      pbVar2 = (bool *)0x1b186b7;
      if (enableRef1) {
        pbVar2 = glcts::fixed_sample_locations_values + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,pbVar2,(ulong)!enableRef1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      pbVar2 = (bool *)0x1b8ef7b;
      if (enableRef2) {
        pbVar2 = glcts::fixed_sample_locations_values + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,pbVar2,(ulong)!enableRef2);
      std::ostream::operator<<(this_00,reference2);
      pbVar2 = (bool *)0x1b186b7;
      if (enableRef2) {
        pbVar2 = glcts::fixed_sample_locations_values + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,pbVar2,(ulong)!enableRef2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      if (enableRef3) {
        pbVar3 = glcts::fixed_sample_locations_values + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,pbVar3,(ulong)!enableRef3);
      std::ostream::operator<<(this_00,reference3);
      if (enableRef3) {
        pbVar4 = glcts::fixed_sample_locations_values + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,pbVar4,(ulong)!enableRef3);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
      }
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyInteger4Mask (tcu::TestContext& testCtx, GLenum name, GLint reference0, bool enableRef0, GLint reference1, bool enableRef1, GLint reference2, bool enableRef2, GLint reference3, bool enableRef3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[4]> intVector4;
	glGetIntegerv(name, intVector4);

	if (!intVector4.verifyValidity(testCtx))
		return;

	if ((enableRef0 && (intVector4[0] != reference0)) ||
		(enableRef1 && (intVector4[1] != reference1)) ||
		(enableRef2 && (intVector4[2] != reference2)) ||
		(enableRef3 && (intVector4[3] != reference3)))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (enableRef0?"":"(") << reference0 << (enableRef0?"":")") << ", "
			<< (enableRef1?"":"(") << reference1 << (enableRef1?"":")") << ", "
			<< (enableRef2?"":"(") << reference2 << (enableRef2?"":")") << ", "
			<< (enableRef3?"":"(") << reference3 << (enableRef3?"":")")	<< TestLog::EndMessage;


		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}